

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfig.cpp
# Opt level: O0

void __thiscall
SoundConfig::writeSettings(SoundConfig *this,QSettings *settings,AudioEnumerator *enumerator)

{
  AudioEnumerator *pAVar1;
  int iVar2;
  const_reference pQVar3;
  QVariant local_118;
  QVariant local_f8;
  QVariant local_d8;
  QVariant local_b8;
  QVariant local_98;
  QStringList local_78;
  undefined1 local_60 [8];
  QString api;
  QString local_38;
  AudioEnumerator *local_20;
  AudioEnumerator *enumerator_local;
  QSettings *settings_local;
  SoundConfig *this_local;
  
  local_20 = enumerator;
  enumerator_local = (AudioEnumerator *)settings;
  settings_local = (QSettings *)this;
  QSettings::beginGroup((QString *)settings);
  pAVar1 = enumerator_local;
  QString::QString(&local_38);
  QSettings::remove((QString *)pAVar1);
  QString::~QString(&local_38);
  QString::QString((QString *)local_60);
  if (this->mBackendIndex != -1) {
    AudioEnumerator::backendNames(&local_78,local_20);
    pQVar3 = QList<QString>::at(&local_78,(long)this->mBackendIndex);
    QString::operator=((QString *)local_60,(QString *)pQVar3);
    QList<QString>::~QList(&local_78);
  }
  pAVar1 = enumerator_local;
  QVariant::QVariant(&local_98,(QString *)local_60);
  QSettings::setValue((QString *)pAVar1,(QVariant *)Keys::api);
  QVariant::~QVariant(&local_98);
  pAVar1 = enumerator_local;
  AudioEnumerator::serializeDevice(&local_b8,local_20,this->mBackendIndex,this->mDeviceIndex);
  QSettings::setValue((QString *)pAVar1,(QVariant *)Keys::deviceId);
  QVariant::~QVariant(&local_b8);
  pAVar1 = enumerator_local;
  iVar2 = samplerate(this);
  QVariant::QVariant(&local_d8,iVar2);
  QSettings::setValue((QString *)pAVar1,(QVariant *)Keys::samplerate);
  QVariant::~QVariant(&local_d8);
  pAVar1 = enumerator_local;
  QVariant::QVariant(&local_f8,this->mLatency);
  QSettings::setValue((QString *)pAVar1,(QVariant *)Keys::latency);
  QVariant::~QVariant(&local_f8);
  pAVar1 = enumerator_local;
  QVariant::QVariant(&local_118,this->mPeriod);
  QSettings::setValue((QString *)pAVar1,(QVariant *)Keys::period);
  QVariant::~QVariant(&local_118);
  QSettings::endGroup();
  QString::~QString((QString *)local_60);
  return;
}

Assistant:

void SoundConfig::writeSettings(QSettings &settings, AudioEnumerator const& enumerator) const {
    settings.beginGroup(Keys::Sound);
    settings.remove(QString());

    QString api;
    // backend index is -1 when there are no available backends
    // which shouldn't be possible since the ma_backend_null is always enabled
    if (mBackendIndex != -1) {
        api = enumerator.backendNames().at(mBackendIndex);
    }

    settings.setValue(Keys::api, api);
    settings.setValue(Keys::deviceId, enumerator.serializeDevice(mBackendIndex, mDeviceIndex));
    settings.setValue(Keys::samplerate, samplerate());
    settings.setValue(Keys::latency, mLatency);
    settings.setValue(Keys::period, mPeriod);

    settings.endGroup();
}